

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

int Sim_UtilCountAllPairs(Vec_Ptr_t *vSuppFun,int nSimWords,Vec_Int_t *vCounters)

{
  void **ppvVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  if (vSuppFun->nSize < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = 1;
    if (1 < nSimWords * 4) {
      uVar3 = (ulong)(uint)(nSimWords * 4);
    }
    ppvVar1 = vSuppFun->pArray;
    lVar4 = 0;
    iVar2 = 0;
    do {
      iVar5 = 0;
      if (0 < nSimWords) {
        uVar6 = 0;
        iVar5 = 0;
        do {
          iVar5 = iVar5 + bit_count[*(byte *)((long)ppvVar1[lVar4] + uVar6)];
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      if (vCounters->nSize <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      iVar5 = ((iVar5 + -1) * iVar5) / 2;
      vCounters->pArray[lVar4] = iVar5;
      iVar2 = iVar2 + iVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vSuppFun->nSize);
  }
  return iVar2;
}

Assistant:

int Sim_UtilCountAllPairs( Vec_Ptr_t * vSuppFun, int nSimWords, Vec_Int_t * vCounters )
{
    unsigned * pSupp;
    int Counter, nOnes, nPairs, i;
    Counter = 0;
    Vec_PtrForEachEntry( unsigned *, vSuppFun, pSupp, i )
    {
        nOnes  = Sim_UtilCountOnes( pSupp, nSimWords );
        nPairs = nOnes * (nOnes - 1) / 2;
        Vec_IntWriteEntry( vCounters, i, nPairs );
        Counter += nPairs;
    }
    return Counter;
}